

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<float> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  int iVar1;
  size_type sVar2;
  undefined8 uVar3;
  long lVar4;
  byte *__s;
  size_t sVar5;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  undefined7 in_register_00000081;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  sign_t sVar14;
  ulong uVar15;
  char *out_00;
  int significand_size_00;
  byte *pbVar16;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_99 [5];
  sign_t local_94;
  int local_90;
  uint local_8c;
  uint local_88;
  int local_84;
  uint local_80;
  undefined1 local_7c [12];
  decimal_fp<float> local_70;
  anon_class_56_7_a2a26a24 local_68;
  ulong uVar13;
  
  uVar10 = fp->significand;
  uVar7 = 0x1f;
  if ((uVar10 | 1) != 0) {
    for (; (uVar10 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  significand_size_00 =
       (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar7 * 2) -
       (uint)(uVar10 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar7 * 2) * 4));
  uVar15 = (ulong)fspecs >> 0x28 & 0xff;
  sVar14 = (sign_t)uVar15;
  local_99[0] = decimal_point;
  local_94 = sVar14;
  local_90 = significand_size_00;
  local_8c = uVar10;
  local_70 = (decimal_fp<float>)fspecs;
  if (-1 < significand_size_00) {
    uVar12 = (significand_size_00 + 1) - (uint)(sVar14 == none);
    uVar13 = (ulong)uVar12;
    iVar1 = fp->exponent;
    local_7c._0_4_ = iVar1 + significand_size_00;
    uVar7 = fspecs.precision;
    uVar9 = fspecs._4_4_;
    if (fspecs._4_1_ == '\x01') {
LAB_002027d1:
      local_84 = iVar1 + significand_size_00 + -1;
      if ((uVar9 >> 0x14 & 1) == 0) {
        local_88 = 0;
        local_80 = (uint)(byte)decimal_point;
        if (significand_size_00 == 1) {
          local_80 = 0;
        }
      }
      else {
        local_88 = 0;
        if (0 < (int)(uVar7 - significand_size_00)) {
          local_88 = uVar7 - significand_size_00;
        }
        uVar13 = (ulong)(uVar12 + local_88);
        local_80 = (uint)CONCAT71(in_register_00000081,decimal_point);
      }
      iVar1 = 1 - local_7c._0_4_;
      if (0 < (int)local_7c._0_4_) {
        iVar1 = local_84;
      }
      lVar4 = 2;
      if (99 < iVar1) {
        lVar4 = (ulong)(999 < iVar1) + 3;
      }
      sVar5 = (3 - (ulong)((char)local_80 == '\0')) + uVar13 + lVar4;
      bVar8 = ((uVar9 >> 0x10 & 1) == 0) << 5;
      local_68.sign = (sign_t *)CONCAT44(uVar10,sVar14);
      local_68.significand._0_5_ = CONCAT14((char)local_80,significand_size_00);
      local_68.significand_size =
           (int *)(CONCAT35(local_68.significand_size._5_3_,CONCAT14(bVar8,local_88)) | 0x4500000000
                  );
      local_68.fp = (decimal_fp<float> *)CONCAT44(local_68.fp._4_4_,local_84);
      if (0 < specs->width) {
        bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                          (out,specs,sVar5,sVar5,(anon_class_28_7_94dcc806 *)&local_68);
        return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )bVar6.container;
      }
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::string::resize((ulong)out.container,(char)sVar5 + (char)sVar2);
      uVar7 = local_88;
      out_00 = ((out.container)->_M_dataplus)._M_p + sVar2;
      if (sVar14 != none) {
        *out_00 = *(char *)((long)&basic_data<void>::signs + uVar15);
        out_00 = out_00 + 1;
      }
      local_7c._4_8_ = out.container;
      __s = (byte *)write_significand<char,_unsigned_int,_0>
                              (out_00,uVar10,significand_size_00,1,(char)local_80);
      pbVar16 = __s;
      if (uVar7 != 0) {
        pbVar16 = __s + uVar7;
        memset(__s,0x30,(ulong)uVar7);
      }
      uVar3 = local_7c._4_8_;
      *pbVar16 = bVar8 | 0x45;
      write_exponent<char,char*>(local_84,(char *)(pbVar16 + 1));
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3;
    }
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar11 = 0x10;
      if (0 < (int)uVar7) {
        uVar11 = uVar7;
      }
      if (((int)local_7c._0_4_ < -3) || ((int)uVar11 < (int)local_7c._0_4_)) goto LAB_002027d1;
    }
    if (-1 < iVar1) {
      sVar5 = (size_t)(iVar1 + uVar12);
      local_99._1_4_ = uVar7 - local_7c._0_4_;
      if ((uVar9 >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ == '\x02') || (0 < (int)local_99._1_4_)) {
          if ((int)local_99._1_4_ < 1) goto LAB_00202989;
        }
        else {
          local_99._1_4_ = 1;
        }
        sVar5 = sVar5 + (uint)local_99._1_4_;
      }
LAB_00202989:
      local_68.sign = &local_94;
      local_68.significand = &local_8c;
      local_68.significand_size = &local_90;
      local_68.fspecs = (float_specs *)&local_70;
      local_68.decimal_point = local_99;
      local_68.num_zeros = (int *)(local_99 + 1);
      local_68.fp = fp;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                        (out,specs,sVar5,sVar5,&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    if (0 < (int)local_7c._0_4_) {
      local_99._1_4_ = uVar7 - significand_size_00 & (int)(uVar9 << 0xb) >> 0x1f;
      local_68.decimal_point = local_99 + 1;
      uVar10 = local_99._1_4_;
      if ((int)local_99._1_4_ < 1) {
        uVar10 = 0;
      }
      sVar5 = uVar10 + uVar13 + 1;
      local_68.sign = &local_94;
      local_68.significand = &local_8c;
      local_68.significand_size = &local_90;
      local_68.fp = (decimal_fp<float> *)local_7c;
      local_68.fspecs = (float_specs *)local_99;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_48d028d1 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    uVar10 = -local_7c._0_4_;
    local_99._1_4_ = uVar10;
    if (SBORROW4(uVar7,uVar10) != (int)(uVar7 + local_7c._0_4_) < 0) {
      local_99._1_4_ = uVar7;
    }
    if ((int)uVar7 < 0) {
      local_99._1_4_ = uVar10;
    }
    if (significand_size_00 != 0) {
      local_99._1_4_ = uVar10;
    }
    if (-1 < (int)local_99._1_4_) {
      sVar5 = (uint)local_99._1_4_ + uVar13 + 2;
      local_68.sign = &local_94;
      local_68.significand = (significand_type *)(local_99 + 1);
      local_68.significand_size = &local_90;
      local_68.fp = &local_70;
      local_68.fspecs = (float_specs *)local_99;
      local_68.decimal_point = (char *)&local_8c;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_9afe1116 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}